

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

int __thiscall Matrix::copy(Matrix *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong *puVar4;
  int *piVar5;
  shared_array<double> *psVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  shared_array<double> *psVar10;
  ulong uVar11;
  Physical *this_00;
  long lVar12;
  Physical local_c8;
  
  std::__cxx11::string::_M_assign((string *)&this->sMatrixName);
  this->nMatrixDimension = *(int *)(dst + 0xd8);
  this->nData = *(int *)(dst + 0xb8);
  this->bReference = (bool)((byte)src ^ 1);
  std::__cxx11::string::_M_assign((string *)&(this->super_Physical).physicalDescription);
  std::__cxx11::string::_M_assign((string *)&this->sMatrixName);
  Unit::operator=(&(this->super_Physical).physicalUnit,(Unit *)(dst + 0x30));
  uVar11 = (ulong)this->nMatrixDimension;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar11;
  uVar3 = SUB168(auVar2 * ZEXT816(0x98),0);
  uVar8 = uVar3 + 8;
  if (0xfffffffffffffff7 < uVar3) {
    uVar8 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(0x98),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar8);
  *puVar4 = uVar11;
  if (uVar11 != 0) {
    lVar9 = 0;
    this_00 = (Physical *)(puVar4 + 1);
    do {
      Physical::Physical(this_00);
      lVar9 = lVar9 + -0x98;
      this_00 = this_00 + 1;
    } while (uVar11 * -0x98 - lVar9 != 0);
  }
  this->pPhysicals = (Physical *)(puVar4 + 1);
  lVar9 = 0;
  lVar12 = 0;
  while( true ) {
    uVar1 = this->nMatrixDimension;
    if ((int)uVar1 <= lVar12) break;
    Physical::Physical(&local_c8,(Physical *)(*(long *)(dst + 0xd0) + lVar9));
    Physical::operator=((Physical *)((long)(this->pPhysicals->physicalUnit).siUnits + lVar9 + -0x34)
                        ,&local_c8);
    Physical::~Physical(&local_c8);
    lVar12 = lVar12 + 1;
    lVar9 = lVar9 + 0x98;
  }
  uVar3 = 0;
  uVar8 = (long)(int)uVar1 << 2;
  if ((int)uVar1 < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  uVar11 = 0;
  if (0 < (int)uVar1) {
    uVar11 = (ulong)uVar1;
  }
  piVar5 = (int *)operator_new__(uVar8);
  this->pSize = piVar5;
  lVar9 = *(long *)(dst + 0xc0);
  for (; uVar11 != uVar3; uVar3 = uVar3 + 1) {
    piVar5[uVar3] = *(int *)(lVar9 + uVar3 * 4);
  }
  piVar5 = (int *)operator_new__(uVar8);
  this->pMult = piVar5;
  lVar9 = *(long *)(dst + 200);
  for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    piVar5[uVar8] = *(int *)(lVar9 + uVar8 * 4);
  }
  if (this->bReference == false) {
    uVar8 = (long)this->nData * 8;
    if ((long)this->nData < 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pdVar7 = (double *)operator_new__(uVar8);
    this->pData = pdVar7;
    boost::shared_array<double>::shared_array<double,MatrixDataDeleter>
              ((shared_array<double> *)&local_c8,pdVar7,(MatrixDataDeleter)0x0);
    boost::shared_array<double>::operator=(&this->matrixParent,(shared_array<double> *)&local_c8);
    boost::detail::shared_count::~shared_count((shared_count *)&local_c8.physicalDescription);
    lVar9 = *(long *)(dst + 0xa0);
    pdVar7 = this->pData;
    psVar10 = (shared_array<double> *)0x0;
    psVar6 = (shared_array<double> *)(ulong)(uint)this->nData;
    if (this->nData < 1) {
      psVar6 = psVar10;
    }
    for (; psVar6 != psVar10; psVar10 = (shared_array<double> *)((long)&psVar10->px + 1)) {
      pdVar7[(long)psVar10] = *(double *)(lVar9 + (long)psVar10 * 8);
    }
  }
  else {
    this->pData = *(double **)(dst + 0xa0);
    psVar6 = boost::shared_array<double>::operator=
                       (&this->matrixParent,(shared_array<double> *)(dst + 0xa8));
  }
  return (int)psVar6;
}

Assistant:

void Matrix::copy( const Matrix &m, bool deep )
{
	// copy main variables
	sMatrixName = m.sMatrixName;
	nMatrixDimension = m.nMatrixDimension;
	nData = m.nData;
	bReference = deep ? false : true;
	physicalDescription = m.physicalDescription;
	sMatrixName = m.sMatrixName;
	physicalUnit = m.physicalUnit;
	
	pPhysicals = new Physical[nMatrixDimension]();
	for( int i=0; i<nMatrixDimension; i++)
		pPhysicals[i] = Physical(m.pPhysicals[i]);

	pSize = new int[nMatrixDimension];
	for( int i=0; i<nMatrixDimension; i++ )
		pSize[i] = m.pSize[i];

	pMult = new int[nMatrixDimension];
	for( int i=0; i<nMatrixDimension; i++ )
		pMult[i] = m.pMult[i];		

	// copy all content if deep copy is wanted
	if( !bReference ) {
		pData = new double[nData];
		matrixParent =  shared_array<double>(pData, MatrixDataDeleter(this));
		for( int i=0; i<nData; i++ )
			pData[i] = m.pData[i];
	}
	// else copy only pointers
	else {
		pData = m.pData;
		matrixParent = m.matrixParent;
	}
}